

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O1

void __thiscall
boost::detail::interruption_checker::interruption_checker
          (interruption_checker *this,pthread_mutex_t *cond_mutex,pthread_cond_t *cond)

{
  thread_data_base *ptVar1;
  bool bVar2;
  int iVar3;
  thread_data_base *ptVar4;
  
  ptVar4 = get_current_thread_data();
  this->thread_info = ptVar4;
  this->m = cond_mutex;
  if (ptVar4 == (thread_data_base *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = ptVar4->interrupt_enabled;
  }
  this->set = bVar2;
  this->done = false;
  if (bVar2 == false) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)cond_mutex);
    if (iVar3 != 0) {
      __assert_fail("!pthread_mutex_lock(m)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                    ,0xd5,
                    "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
                   );
    }
  }
  else {
    mutex::lock(&ptVar4->data_mutex);
    check_for_interruption(this);
    ptVar1 = this->thread_info;
    ptVar1->cond_mutex = cond_mutex;
    ptVar1->current_cond = cond;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)this->m);
    if (iVar3 != 0) {
      __assert_fail("!pthread_mutex_lock(m)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/thread_data.hpp"
                    ,0xd1,
                    "boost::detail::interruption_checker::interruption_checker(pthread_mutex_t *, pthread_cond_t *)"
                   );
    }
    mutex::unlock(&ptVar4->data_mutex);
  }
  return;
}

Assistant:

explicit interruption_checker(pthread_mutex_t* cond_mutex,pthread_cond_t* cond):
                thread_info(detail::get_current_thread_data()),m(cond_mutex),
                set(thread_info && thread_info->interrupt_enabled), done(false)
            {
                if(set)
                {
                    lock_guard<mutex> guard(thread_info->data_mutex);
                    check_for_interruption();
                    thread_info->cond_mutex=cond_mutex;
                    thread_info->current_cond=cond;
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
                else
                {
                    BOOST_VERIFY(!pthread_mutex_lock(m));
                }
            }